

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_CreateTest_CreateEmptyAndSetImages_Test::TestBody
          (ktxTexture1_CreateTest_CreateEmptyAndSetImages_Test *this)

{
  bool bVar1;
  char *in_RDI;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture1 *texture;
  char (*in_stack_fffffffffffffeb8) [28];
  AssertionResult *in_stack_fffffffffffffec0;
  bool *in_stack_fffffffffffffec8;
  Message *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  int line;
  Type in_stack_fffffffffffffeec;
  AssertHelper *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> *in_stack_ffffffffffffff00;
  string local_f0 [16];
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  ktx_uint8_t *in_stack_ffffffffffffff30;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  AssertionResult local_b8;
  uint local_a4;
  string local_a0 [40];
  bool *local_78;
  undefined1 local_61;
  AssertionResult local_60 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  ktx_error_code_e local_14;
  long local_10 [2];
  
  local_10[0] = 0;
  local_14 = ktxTexture1_Create(*(undefined8 *)(in_RDI + 0x188),1,local_10);
  local_2c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             (ktx_error_code_e *)in_stack_fffffffffffffec8,
             (ktx_error_code_e *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffed8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x130ba2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_RDI,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(char *)in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (Message *)in_stack_ffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x130bff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130c6d);
  local_61 = local_10[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffec0,(bool *)in_stack_fffffffffffffeb8,(type *)0x130c9b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffed0 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffec8 = (bool *)ktxErrorString(local_14);
    local_78 = in_stack_fffffffffffffec8;
    in_stack_fffffffffffffec0 =
         (AssertionResult *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffec0,(char **)in_stack_fffffffffffffeb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_RDI,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(char *)in_stack_fffffffffffffed0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (Message *)in_stack_ffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_a0);
    testing::Message::~Message((Message *)0x130dbf);
  }
  local_a4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130e6c);
  if (local_a4 == 0) {
    local_14 = TextureWriterTestHelper<unsigned_char,_4U,_32856U>::copyImagesToTexture
                         (in_stack_ffffffffffffff00,
                          (ktxTexture1 *)
                          CONCAT17(in_stack_fffffffffffffeff,
                                   CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    uVar2 = local_14 == KTX_SUCCESS;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffec0,(bool *)in_stack_fffffffffffffeb8,(type *)0x130ec8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_RDI,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(char *)in_stack_fffffffffffffed0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff40),
                 (Message *)in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
      std::__cxx11::string::~string(local_f0);
      testing::Message::~Message((Message *)0x130f89);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x131030);
    if (local_a4 == 0) {
      TextureWriterTestHelper<unsigned_char,_4U,_32856U>::compareTexture1Images
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8,&in_stack_fffffffffffffec0->success_);
      line = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff00);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffef0);
        testing::AssertionResult::failure_message((AssertionResult *)0x1310c6);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_RDI,line,
                   (char *)in_stack_fffffffffffffed0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff40),
                   (Message *)in_stack_ffffffffffffff38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
        testing::Message::~Message((Message *)0x131112);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x131174);
      if (local_10[0] != 0) {
        ktxTexture1_Destroy(local_10[0]);
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture1_CreateTest, CreateEmptyAndSetImages) {
    ktxTexture1* texture = 0;
    KTX_error_code result;

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                &texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);

    result = helper.copyImagesToTexture(texture);
    ASSERT_TRUE(result == KTX_SUCCESS);
    // imageData is an RGBA texture so no rounding is necessary and we can
    // use this simple comparison.
    EXPECT_EQ(helper.compareTexture1Images(texture->pData), true);

    if (texture)
        ktxTexture1_Destroy(texture);
}